

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Cues::Init(Cues *this)

{
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  bool bVar4;
  longlong idpos;
  long pos;
  long lVar5;
  long lVar6;
  long len;
  long cue_points_size;
  long local_48;
  IMkvReader *local_40;
  long local_38;
  
  bVar4 = true;
  if (this->m_cue_points == (CuePoint **)0x0) {
    if (this->m_preload_count == 0 && this->m_count == 0) {
      local_40 = this->m_pSegment->m_pReader;
      local_38 = 0;
      bVar4 = true;
      if (0 < this->m_size) {
        lVar6 = this->m_size + this->m_start;
        pos = this->m_start;
        do {
          lVar2 = ReadID(local_40,pos,&local_48);
          if ((((lVar2 < 0) || (lVar5 = local_48 + pos, lVar6 < lVar5)) ||
              (lVar3 = ReadUInt(local_40,lVar5,&local_48), lVar3 < 0)) ||
             (((lVar6 < lVar5 + local_48 || (lVar5 = lVar5 + local_48 + lVar3, lVar6 < lVar5)) ||
              ((lVar2 == 0xbb && (bVar1 = PreloadCuePoint(this,&local_38,pos), !bVar1))))))
          goto LAB_00158659;
          pos = lVar5;
        } while (lVar5 < lVar6);
      }
    }
    else {
LAB_00158659:
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Cues::Init() const {
  if (m_cue_points)
    return true;

  if (m_count != 0 || m_preload_count != 0)
    return false;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  const long long stop = m_start + m_size;
  long long pos = m_start;

  long cue_points_size = 0;

  while (pos < stop) {
    const long long idpos = pos;

    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if (size < 0 || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if (pos + size > stop) {
      return false;
    }

    if (id == libwebm::kMkvCuePoint) {
      if (!PreloadCuePoint(cue_points_size, idpos))
        return false;
    }

    pos += size;  // skip payload
  }
  return true;
}